

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

module_ * __thiscall
pybind11::module_::
def<ImVec2(*)(double,double,int),pybind11::arg,pybind11::arg,pybind11::arg_v,char[154]>
          (module_ *this,char *name_,_func_ImVec2_double_double_int **f,arg *extra,arg *extra_1,
          arg_v *extra_2,char (*extra_3) [154])

{
  _func_ImVec2_double_double_int *f_00;
  handle local_60;
  cpp_function func;
  object local_50;
  scope local_48;
  name local_40;
  sibling local_38;
  
  f_00 = *f;
  local_48.value.m_ptr = (handle)(this->super_object).super_handle.m_ptr;
  local_50.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_40.value = name_;
  getattr((pybind11 *)&local_60,local_48.value,name_,(PyObject *)&_Py_NoneStruct);
  local_38.value.m_ptr = (handle)(handle)local_60.m_ptr;
  cpp_function::
  cpp_function<ImVec2,double,double,int,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::arg,pybind11::arg,pybind11::arg_v,char[154]>
            (&func,f_00,&local_40,&local_48,&local_38,extra,extra_1,extra_2,extra_3);
  object::~object((object *)&local_60);
  object::~object(&local_50);
  add_object(this,name_,(handle)func.super_function.super_object.super_handle.m_ptr,true);
  object::~object((object *)&func);
  return this;
}

Assistant:

module_ &def(const char *name_, Func &&f, const Extra& ... extra) {
        cpp_function func(std::forward<Func>(f), name(name_), scope(*this),
                          sibling(getattr(*this, name_, none())), extra...);
        // NB: allow overwriting here because cpp_function sets up a chain with the intention of
        // overwriting (and has already checked internally that it isn't overwriting non-functions).
        add_object(name_, func, true /* overwrite */);
        return *this;
    }